

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

int __thiscall PP_Expression::AND_expression(PP_Expression *this)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  uVar1 = equality_expression(this);
  uVar3 = 0xffffffff;
  lVar2 = (this->super_Parser).index;
  while ((lVar2 < (this->super_Parser).symbols.d.size &&
         ((this->super_Parser).symbols.d.ptr[lVar2].token == AND))) {
    (this->super_Parser).index = lVar2 + 1;
    uVar3 = uVar3 & uVar1;
    uVar1 = equality_expression(this);
    lVar2 = (this->super_Parser).index;
  }
  return uVar3 & uVar1;
}

Assistant:

int PP_Expression::AND_expression()
{
    int value = equality_expression();
    if (test(PP_AND))
        return value & AND_expression();
    return value;
}